

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_client.c
# Opt level: O0

void proxy_client_free(proxy_client_handle *ch)

{
  conn_handle *conn;
  proxy_client_priv *priv;
  proxy_client_handle *ch_local;
  
  conn = (conn_handle *)ch->priv;
  if (ch->priv != (void *)0x0) {
    proxy_client_disconnect(ch);
    conn_free(conn);
    free(ch->priv);
    ch->priv = (void *)0x0;
  }
  return;
}

Assistant:

void proxy_client_free(struct proxy_client_handle *ch)
{
	struct proxy_client_priv *priv = ch->priv;

	if (ch->priv != NULL) {
		proxy_client_disconnect(ch);

		conn_free(&priv->conn);

		free(ch->priv);
		ch->priv = NULL;
	}
}